

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::detail::
     json_serialize_tuple_helper<3UL,_3UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ::encode(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *tuple,basic_json_visitor<char> *encoder,
             basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,error_code *ec)

{
  bool bVar1;
  error_code *in_RCX;
  basic_json_visitor<char> *in_RDX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  error_code *in_stack_ffffffffffffffd8;
  
  std::
  get<0ul,std::__cxx11::string,jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::__cxx11::string>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x324942);
  encode_traits<std::__cxx11::string,char,void>::
  encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tuple,encoder,
             proto,ec);
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (!bVar1) {
    json_serialize_tuple_helper<2UL,_3UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::encode(in_RSI,in_RDX,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RCX,
             in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void encode(const Tuple& tuple,
                               basic_json_visitor<char_type>& encoder, 
                               const Json& proto, 
                               std::error_code& ec)
            {
                encode_traits<element_type,char_type>::encode(std::get<Size-Pos>(tuple), encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                next::encode(tuple, encoder, proto, ec);
            }